

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.hpp
# Opt level: O2

void __thiscall
duckdb::BlockManager::SetBlockAllocSize(BlockManager *this,optional_idx block_alloc_size_p)

{
  idx_t index;
  InternalException *this_00;
  allocator local_41;
  optional_idx block_alloc_size_p_local;
  string local_38;
  
  block_alloc_size_p_local = block_alloc_size_p;
  if ((this->block_alloc_size).index == 0xffffffffffffffff) {
    index = optional_idx::GetIndex(&block_alloc_size_p_local);
    optional_idx::optional_idx((optional_idx *)&local_38,index);
    (this->block_alloc_size).index = (idx_t)local_38._M_dataplus._M_p;
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"the block allocation size must be set once",&local_41);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SetBlockAllocSize(const optional_idx block_alloc_size_p) {
		if (block_alloc_size.IsValid()) {
			throw InternalException("the block allocation size must be set once");
		}
		block_alloc_size = block_alloc_size_p.GetIndex();
	}